

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_Tree>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_Tree>_>_>
* __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_Tree>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_Tree>_>_>
::operator=(raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_Tree>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_Tree>_>_>
            *this,raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_Tree>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_Tree>_>_>
                  *that)

{
  allocator_type *a;
  undefined1 local_48 [8];
  raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_Tree>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_Tree>_>_>
  tmp;
  raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_Tree>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_Tree>_>_>
  *that_local;
  raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_Tree>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_Tree>_>_>
  *this_local;
  
  tmp.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_Tree>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (_Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_Tree>_>_>
        )(_Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_Tree>_>_>
          )that;
  a = alloc_ref(this);
  raw_hash_set((raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_Tree>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_Tree>_>_>
                *)local_48,that,a);
  swap(this,(raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_Tree>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_Tree>_>_>
             *)local_48);
  ~raw_hash_set((raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_Tree>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_Tree>_>_>
                 *)local_48);
  return this;
}

Assistant:

raw_hash_set& operator=(const raw_hash_set& that) {
        raw_hash_set tmp(that,
                         AllocTraits::propagate_on_container_copy_assignment::value
                         ? that.alloc_ref()
                         : alloc_ref());
        swap(tmp);
        return *this;
    }